

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,size_t MinSize)

{
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *RHS;
  move_iterator<llvm::DWARFDebugLoc::LocationList_*> __first;
  ulong uVar1;
  LocationList *__result;
  ulong uVar2;
  long extraout_RDX;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *__size;
  long lVar3;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *__ptr;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar2 = uVar1 >> 1 | uVar1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar1 = (uVar1 >> 0x20 | uVar2 >> 0x10 | uVar2) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  __size = (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)(uVar1 * 0x68);
  __result = (LocationList *)malloc((size_t)__size);
  if (__result == (LocationList *)0x0) {
    SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,false>::grow();
    if (__size != (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)MinSize) {
      lVar3 = 8;
      do {
        RHS = (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)
              ((__size->super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>).InlineElts[0].
               buffer + lVar3 + -0x10);
        *(undefined8 *)(extraout_RDX + -8 + lVar3) =
             *(undefined8 *)
              ((__size->super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>).InlineElts[0].
               buffer + lVar3 + -0x18);
        SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::SmallVector
                  ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)(extraout_RDX + lVar3),RHS);
        lVar3 = lVar3 + 0x68;
      } while (RHS + 1 != (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)MinSize);
    }
    return;
  }
  __first._M_current =
       (LocationList *)
       (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
       super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::LocationList*>,llvm::DWARFDebugLoc::LocationList*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>
                     ).super_SmallVectorBase.Size,__result);
  __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)
          (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.BeginX;
  uVar2 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                 super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    lVar3 = uVar2 * 0x68;
    do {
      SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
                ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)
                 ((long)&__ptr[-6].
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                         super_SmallVectorBase.BeginX + lVar3));
      lVar3 = lVar3 + -0x68;
    } while (lVar3 != 0);
    __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)
            (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
            super_SmallVectorBase.BeginX;
  }
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.BeginX = __result;
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}